

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector3 * vector3_multiplym4(vector3 *self,matrix4 *mT)

{
  undefined1 local_30 [8];
  vector3 vR;
  matrix4 *mT_local;
  vector3 *self_local;
  
  vR.field_0.v[2] = (double)mT;
  vector3_zero((vector3 *)local_30);
  matrix4_multiplyv3((matrix4 *)vR.field_0.v[2],self,(vector3 *)local_30);
  vector3_set(self,(vector3 *)local_30);
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_multiplym4(struct vector3 *self, const struct matrix4 *mT)
{
	struct vector3 vR;

	vector3_zero(&vR);

	matrix4_multiplyv3(mT, self, &vR);

	vector3_set(self, &vR);

	return self;
}